

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.hpp
# Opt level: O2

void __thiscall
diy::Master::Command<PointBlock<3U>_>::execute
          (Command<PointBlock<3U>_> *this,void *b,ProxyWithLink *cp)

{
  Catch::clara::std::function<void_(PointBlock<3U>_*,_const_diy::Master::ProxyWithLink_&)>::
  operator()(&this->f,(PointBlock<3U> *)b,cp);
  return;
}

Assistant:

void  execute(void* b, const ProxyWithLink& cp) const override                { f(static_cast<Block*>(b), cp); }